

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local-graph.h
# Opt level: O0

Sets * __thiscall wasm::LocalGraph::getSets(LocalGraph *this,LocalGet *get)

{
  bool bVar1;
  int iVar2;
  pointer pvVar3;
  _Node_iterator_base<std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>,_false>
  local_30;
  _Node_iterator_base<std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>,_false>
  local_28;
  const_iterator iter;
  LocalGet *get_local;
  LocalGraph *this_local;
  
  iter.
  super__Node_iterator_base<std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>,_false>
  ._M_cur = (_Node_iterator_base<std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>,_false>
             )(_Node_iterator_base<std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>,_false>
               )get;
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<wasm::LocalGet_*,_wasm::SmallSet<wasm::LocalSet_*,_2UL>,_std::hash<wasm::LocalGet_*>,_std::equal_to<wasm::LocalGet_*>,_std::allocator<std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>_>_>
       ::find(&this->getSetsMap,(key_type *)&iter);
  local_30._M_cur =
       (__node_type *)
       std::
       unordered_map<wasm::LocalGet_*,_wasm::SmallSet<wasm::LocalSet_*,_2UL>,_std::hash<wasm::LocalGet_*>,_std::equal_to<wasm::LocalGet_*>,_std::allocator<std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>_>_>
       ::end(&this->getSetsMap);
  bVar1 = std::__detail::operator==(&local_28,&local_30);
  if (bVar1) {
    if (getSets(wasm::LocalGet*)::empty == '\0') {
      iVar2 = __cxa_guard_acquire(&getSets(wasm::LocalGet*)::empty);
      if (iVar2 != 0) {
        SmallSet<wasm::LocalSet_*,_2UL>::SmallSet(&getSets::empty);
        __cxa_atexit(SmallSet<wasm::LocalSet_*,_2UL>::~SmallSet,&getSets::empty,&__dso_handle);
        __cxa_guard_release(&getSets(wasm::LocalGet*)::empty);
      }
    }
    this_local = (LocalGraph *)&getSets::empty;
  }
  else {
    pvVar3 = std::__detail::
             _Node_const_iterator<std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>,_false,_false>
             ::operator->((_Node_const_iterator<std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>,_false,_false>
                           *)&local_28);
    this_local = (LocalGraph *)&pvVar3->second;
  }
  return (Sets *)this_local;
}

Assistant:

const Sets& getSets(LocalGet* get) const {
    auto iter = getSetsMap.find(get);
    if (iter == getSetsMap.end()) {
      // A missing entry means there is nothing there (and we saved a little
      // space by not putting something there).
      //
      // Use a canonical constant empty set to avoid allocation.
      static const Sets empty;
      return empty;
    }
    return iter->second;
  }